

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetFieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *field)

{
  string local_90;
  AlphaNum local_70;
  size_type local_40;
  pointer local_38;
  
  GetPropertyName_abi_cxx11_(&local_90,this,field);
  local_40 = local_90._M_string_length;
  local_38 = local_90._M_dataplus._M_p;
  local_70.piece_ = absl::lts_20250127::NullSafeStringView("FieldNumber");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFieldConstantName(const FieldDescriptor* field) {
  return absl::StrCat(GetPropertyName(field), "FieldNumber");
}